

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *summands)

{
  bool bVar1;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_RSI;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_ffffffffffffff48;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_ffffffffffffff50;
  undefined1 **local_80;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *in_stack_ffffffffffffffb0;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  in_stack_ffffffffffffffb8;
  undefined1 *local_20;
  undefined8 local_18;
  
  bVar1 = Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::isEmpty(in_RSI);
  if (bVar1) {
    Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::zero();
    local_20 = &stack0xffffffffffffffb0;
    local_18 = 1;
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    local_80 = &local_20;
    do {
      local_80 = local_80 + -6;
      Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
                ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x458504);
    } while (local_80 != (undefined1 **)&stack0xffffffffffffffb0);
  }
  else {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  return;
}

Assistant:

Polynom<Number>::Polynom(Stack<Monom>&& summands) 
  : _summands(
      summands.isEmpty() 
        ? Stack<Monom>{Monom::zero()} 
        : std::move(summands)) 
{ /* integrity(); */ }